

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O3

void av1_quantize_fp_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  long lVar1;
  tran_low_t *ptVar2;
  short *psVar3;
  short *psVar4;
  long lVar5;
  short sVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [16];
  short sVar17;
  undefined1 auVar21 [12];
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  short sVar28;
  ushort uVar29;
  undefined1 auVar33 [12];
  short sVar36;
  short sVar38;
  short sVar40;
  short sVar42;
  ushort uVar45;
  undefined1 auVar34 [16];
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  ushort uVar44;
  ushort uVar46;
  undefined1 auVar35 [16];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar72;
  ushort uVar73;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  short sVar91;
  undefined1 auVar92 [16];
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  short sVar11;
  undefined6 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [12];
  undefined6 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  undefined1 auVar77 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar78 [16];
  undefined1 auVar84 [16];
  undefined1 auVar79 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [16];
  undefined1 auVar99 [16];
  undefined1 auVar105 [16];
  undefined1 auVar111 [16];
  undefined1 auVar117 [16];
  undefined1 auVar123 [16];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar106 [16];
  undefined1 auVar112 [16];
  undefined1 auVar118 [16];
  undefined1 auVar124 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar119 [16];
  undefined1 auVar125 [16];
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar108 [16];
  undefined1 auVar114 [16];
  undefined1 auVar120 [16];
  undefined1 auVar126 [16];
  undefined1 auVar97 [16];
  undefined1 auVar103 [16];
  undefined1 auVar109 [16];
  undefined1 auVar115 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [16];
  short sVar135;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  
  auVar23 = *(undefined1 (*) [16])round_ptr;
  auVar6._0_8_ = auVar23._8_8_;
  auVar6._8_4_ = auVar23._8_4_;
  auVar6._12_4_ = auVar23._12_4_;
  auVar56 = *(undefined1 (*) [16])quant_ptr;
  auVar9._0_8_ = auVar56._8_8_;
  auVar9._8_4_ = auVar56._8_4_;
  auVar9._12_4_ = auVar56._12_4_;
  auVar131 = *(undefined1 (*) [16])dequant_ptr;
  sVar12 = auVar131._8_2_;
  sVar13 = auVar131._10_2_;
  sVar14 = auVar131._12_2_;
  sVar15 = auVar131._14_2_;
  auVar132 = psraw(auVar131,1);
  auVar16._8_2_ = sVar12;
  auVar16._0_8_ = auVar131._8_8_;
  auVar16._10_2_ = sVar13;
  auVar16._12_2_ = sVar14;
  auVar16._14_2_ = sVar15;
  auVar16 = psraw(auVar16,1);
  auVar128 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar74 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc));
  uVar29 = 0;
  uVar37 = 0;
  uVar39 = 0;
  uVar41 = 0;
  uVar43 = 0;
  uVar44 = 0;
  uVar45 = 0;
  uVar46 = 0;
  sVar17 = auVar128._0_2_;
  sVar8 = -sVar17;
  sVar24 = auVar128._2_2_;
  sVar11 = -sVar24;
  sVar25 = auVar128._4_2_;
  sVar135 = -sVar25;
  sVar26 = auVar128._6_2_;
  sVar136 = -sVar26;
  sVar27 = auVar128._8_2_;
  sVar137 = -sVar27;
  sVar28 = auVar128._10_2_;
  sVar138 = -sVar28;
  sVar36 = auVar128._12_2_;
  sVar139 = -sVar36;
  sVar38 = auVar128._14_2_;
  sVar140 = -sVar38;
  auVar22._0_2_ = (ushort)(sVar8 < sVar17) * sVar17 | (ushort)(sVar8 >= sVar17) * sVar8;
  auVar22._2_2_ = (ushort)(sVar11 < sVar24) * sVar24 | (ushort)(sVar11 >= sVar24) * sVar11;
  auVar22._4_2_ = (ushort)(sVar135 < sVar25) * sVar25 | (ushort)(sVar135 >= sVar25) * sVar135;
  auVar22._6_2_ = (ushort)(sVar136 < sVar26) * sVar26 | (ushort)(sVar136 >= sVar26) * sVar136;
  auVar22._8_2_ = (ushort)(sVar137 < sVar27) * sVar27 | (ushort)(sVar137 >= sVar27) * sVar137;
  auVar22._10_2_ = (ushort)(sVar138 < sVar28) * sVar28 | (ushort)(sVar138 >= sVar28) * sVar138;
  auVar22._12_2_ = (ushort)(sVar139 < sVar36) * sVar36 | (ushort)(sVar139 >= sVar36) * sVar139;
  auVar22._14_2_ = (ushort)(sVar140 < sVar38) * sVar38 | (ushort)(sVar140 >= sVar38) * sVar140;
  sVar17 = auVar74._0_2_;
  sVar8 = -sVar17;
  sVar24 = auVar74._2_2_;
  sVar11 = -sVar24;
  sVar25 = auVar74._4_2_;
  sVar135 = -sVar25;
  sVar26 = auVar74._6_2_;
  sVar136 = -sVar26;
  sVar27 = auVar74._8_2_;
  sVar137 = -sVar27;
  sVar28 = auVar74._10_2_;
  sVar138 = -sVar28;
  sVar36 = auVar74._12_2_;
  sVar139 = -sVar36;
  sVar38 = auVar74._14_2_;
  sVar140 = -sVar38;
  auVar34._0_2_ = (ushort)(sVar8 < sVar17) * sVar17 | (ushort)(sVar8 >= sVar17) * sVar8;
  auVar34._2_2_ = (ushort)(sVar11 < sVar24) * sVar24 | (ushort)(sVar11 >= sVar24) * sVar11;
  auVar34._4_2_ = (ushort)(sVar135 < sVar25) * sVar25 | (ushort)(sVar135 >= sVar25) * sVar135;
  auVar34._6_2_ = (ushort)(sVar136 < sVar26) * sVar26 | (ushort)(sVar136 >= sVar26) * sVar136;
  auVar34._8_2_ = (ushort)(sVar137 < sVar27) * sVar27 | (ushort)(sVar137 >= sVar27) * sVar137;
  auVar34._10_2_ = (ushort)(sVar138 < sVar28) * sVar28 | (ushort)(sVar138 >= sVar28) * sVar138;
  auVar34._12_2_ = (ushort)(sVar139 < sVar36) * sVar36 | (ushort)(sVar139 >= sVar36) * sVar139;
  auVar34._14_2_ = (ushort)(sVar140 < sVar38) * sVar38 | (ushort)(sVar140 >= sVar38) * sVar140;
  auVar133._0_2_ = -(ushort)((short)auVar22._0_2_ < auVar132._0_2_);
  auVar133._2_2_ = -(ushort)((short)auVar22._2_2_ < auVar132._2_2_);
  auVar133._4_2_ = -(ushort)((short)auVar22._4_2_ < auVar132._4_2_);
  auVar133._6_2_ = -(ushort)((short)auVar22._6_2_ < auVar132._6_2_);
  auVar133._8_2_ = -(ushort)((short)auVar22._8_2_ < auVar132._8_2_);
  auVar133._10_2_ = -(ushort)((short)auVar22._10_2_ < auVar132._10_2_);
  auVar133._12_2_ = -(ushort)((short)auVar22._12_2_ < auVar132._12_2_);
  auVar133._14_2_ = -(ushort)((short)auVar22._14_2_ < auVar132._14_2_);
  auVar132._8_4_ = 0xffffffff;
  auVar132._0_8_ = 0xffffffffffffffff;
  auVar132._12_4_ = 0xffffffff;
  sVar8 = auVar16._0_2_;
  auVar134._0_2_ = -(ushort)((short)auVar34._0_2_ < sVar8);
  sVar11 = auVar16._2_2_;
  auVar134._2_2_ = -(ushort)((short)auVar34._2_2_ < sVar11);
  sVar135 = auVar16._4_2_;
  auVar134._4_2_ = -(ushort)((short)auVar34._4_2_ < sVar135);
  sVar136 = auVar16._6_2_;
  auVar134._6_2_ = -(ushort)((short)auVar34._6_2_ < sVar136);
  sVar137 = auVar16._8_2_;
  auVar134._8_2_ = -(ushort)((short)auVar34._8_2_ < sVar137);
  sVar138 = auVar16._10_2_;
  auVar134._10_2_ = -(ushort)((short)auVar34._10_2_ < sVar138);
  sVar139 = auVar16._12_2_;
  sVar140 = auVar16._14_2_;
  auVar134._12_2_ = -(ushort)((short)auVar34._12_2_ < sVar139);
  auVar134._14_2_ = -(ushort)((short)auVar34._14_2_ < sVar140);
  auVar16 = auVar134 ^ auVar132 | auVar133 ^ auVar132;
  if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar16 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar16 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar16 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar16 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar16 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar16 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar16 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar16 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar16 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar16 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar16 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf]) {
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar128 = psraw(auVar128,0xf);
    auVar132 = psraw(auVar74,0xf);
    auVar23 = paddsw(auVar22,auVar23);
    auVar16 = paddsw(auVar34,auVar6);
    auVar23 = pmulhw(auVar23,auVar56);
    auVar16 = pmulhw(auVar16,auVar9);
    auVar23 = auVar23 ^ auVar128;
    auVar16 = auVar16 ^ auVar132;
    sVar17 = auVar23._0_2_ - auVar128._0_2_;
    sVar24 = auVar23._2_2_ - auVar128._2_2_;
    sVar25 = auVar23._4_2_ - auVar128._4_2_;
    uVar18 = CONCAT24(sVar25,CONCAT22(sVar24,sVar17));
    sVar26 = auVar23._6_2_ - auVar128._6_2_;
    uVar19 = CONCAT26(sVar26,uVar18);
    sVar27 = auVar23._8_2_ - auVar128._8_2_;
    auVar20._0_10_ = CONCAT28(sVar27,uVar19);
    auVar20._10_2_ = auVar23._10_2_ - auVar128._10_2_;
    auVar56._12_2_ = auVar23._12_2_ - auVar128._12_2_;
    auVar56._0_12_ = auVar20;
    auVar56._14_2_ = auVar23._14_2_ - auVar128._14_2_;
    sVar28 = auVar16._0_2_ - auVar132._0_2_;
    sVar36 = auVar16._2_2_ - auVar132._2_2_;
    sVar38 = auVar16._4_2_ - auVar132._4_2_;
    uVar30 = CONCAT24(sVar38,CONCAT22(sVar36,sVar28));
    sVar40 = auVar16._6_2_ - auVar132._6_2_;
    uVar31 = CONCAT26(sVar40,uVar30);
    sVar42 = auVar16._8_2_ - auVar132._8_2_;
    auVar32._0_10_ = CONCAT28(sVar42,uVar31);
    auVar32._10_2_ = auVar16._10_2_ - auVar132._10_2_;
    auVar74._12_2_ = auVar16._12_2_ - auVar132._12_2_;
    auVar74._0_12_ = auVar32;
    auVar74._14_2_ = auVar16._14_2_ - auVar132._14_2_;
    auVar23 = psraw(auVar56,0xf);
    auVar97._12_2_ = sVar26;
    auVar97._0_12_ = auVar20;
    auVar97._14_2_ = auVar23._6_2_;
    auVar96._12_4_ = auVar97._12_4_;
    auVar96._10_2_ = auVar23._4_2_;
    auVar96._0_10_ = auVar20._0_10_;
    auVar95._10_6_ = auVar96._10_6_;
    auVar95._8_2_ = sVar25;
    auVar95._0_8_ = uVar19;
    auVar94._8_8_ = auVar95._8_8_;
    auVar94._6_2_ = auVar23._2_2_;
    auVar94._0_6_ = uVar18;
    auVar93._6_10_ = auVar94._6_10_;
    auVar93._4_2_ = sVar24;
    auVar93._0_4_ = CONCAT22(sVar24,sVar17);
    auVar92._4_12_ = auVar93._4_12_;
    auVar92._2_2_ = auVar23._0_2_;
    auVar92._0_2_ = sVar17;
    *(undefined1 (*) [16])qcoeff_ptr = auVar92;
    *(short *)(qcoeff_ptr + 4) = sVar27;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar23._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar20._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar23._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar56._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar23._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar56._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar23._14_2_;
    auVar23 = psraw(auVar74,0xf);
    auVar103._12_2_ = sVar40;
    auVar103._0_12_ = auVar32;
    auVar103._14_2_ = auVar23._6_2_;
    auVar102._12_4_ = auVar103._12_4_;
    auVar102._10_2_ = auVar23._4_2_;
    auVar102._0_10_ = auVar32._0_10_;
    auVar101._10_6_ = auVar102._10_6_;
    auVar101._8_2_ = sVar38;
    auVar101._0_8_ = uVar31;
    auVar100._8_8_ = auVar101._8_8_;
    auVar100._6_2_ = auVar23._2_2_;
    auVar100._0_6_ = uVar30;
    auVar99._6_10_ = auVar100._6_10_;
    auVar99._4_2_ = sVar36;
    auVar99._0_4_ = CONCAT22(sVar36,sVar28);
    auVar98._4_12_ = auVar99._4_12_;
    auVar98._2_2_ = auVar23._0_2_;
    auVar98._0_2_ = sVar28;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar98;
    *(short *)(qcoeff_ptr + 0xc) = sVar42;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar23._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = auVar32._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar23._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = auVar74._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar23._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar74._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar23._14_2_;
    sVar17 = sVar17 * auVar131._0_2_;
    sVar24 = sVar24 * auVar131._2_2_;
    sVar25 = sVar25 * auVar131._4_2_;
    uVar18 = CONCAT24(sVar25,CONCAT22(sVar24,sVar17));
    sVar26 = sVar26 * auVar131._6_2_;
    uVar19 = CONCAT26(sVar26,uVar18);
    sVar27 = sVar27 * sVar12;
    auVar21._0_10_ = CONCAT28(sVar27,uVar19);
    auVar21._10_2_ = auVar20._10_2_ * sVar13;
    auVar23._12_2_ = auVar56._12_2_ * sVar14;
    auVar23._0_12_ = auVar21;
    auVar23._14_2_ = auVar56._14_2_ * sVar15;
    sVar28 = sVar28 * sVar12;
    sVar36 = sVar36 * sVar13;
    sVar38 = sVar38 * sVar14;
    uVar30 = CONCAT24(sVar38,CONCAT22(sVar36,sVar28));
    sVar40 = sVar40 * sVar15;
    uVar31 = CONCAT26(sVar40,uVar30);
    sVar42 = sVar42 * sVar12;
    auVar33._0_10_ = CONCAT28(sVar42,uVar31);
    auVar33._10_2_ = auVar32._10_2_ * sVar13;
    auVar131._12_2_ = auVar74._12_2_ * sVar14;
    auVar131._0_12_ = auVar33;
    auVar131._14_2_ = auVar74._14_2_ * sVar15;
    auVar56 = psraw(auVar23,0xf);
    auVar79._12_2_ = sVar26;
    auVar79._0_12_ = auVar21;
    auVar79._14_2_ = auVar56._6_2_;
    auVar78._12_4_ = auVar79._12_4_;
    auVar78._10_2_ = auVar56._4_2_;
    auVar78._0_10_ = auVar21._0_10_;
    auVar128._10_6_ = auVar78._10_6_;
    auVar128._8_2_ = sVar25;
    auVar128._0_8_ = uVar19;
    auVar77._8_8_ = auVar128._8_8_;
    auVar77._6_2_ = auVar56._2_2_;
    auVar77._0_6_ = uVar18;
    auVar76._6_10_ = auVar77._6_10_;
    auVar76._4_2_ = sVar24;
    auVar76._0_4_ = CONCAT22(sVar24,sVar17);
    auVar75._4_12_ = auVar76._4_12_;
    auVar75._2_2_ = auVar56._0_2_;
    auVar75._0_2_ = sVar17;
    *(undefined1 (*) [16])dqcoeff_ptr = auVar75;
    *(short *)(dqcoeff_ptr + 4) = sVar27;
    *(short *)((long)dqcoeff_ptr + 0x12) = auVar56._8_2_;
    *(short *)(dqcoeff_ptr + 5) = auVar21._10_2_;
    *(short *)((long)dqcoeff_ptr + 0x16) = auVar56._10_2_;
    *(short *)(dqcoeff_ptr + 6) = auVar23._12_2_;
    *(short *)((long)dqcoeff_ptr + 0x1a) = auVar56._12_2_;
    *(short *)(dqcoeff_ptr + 7) = auVar23._14_2_;
    *(short *)((long)dqcoeff_ptr + 0x1e) = auVar56._14_2_;
    auVar56 = psraw(auVar131,0xf);
    auVar85._12_2_ = sVar40;
    auVar85._0_12_ = auVar33;
    auVar85._14_2_ = auVar56._6_2_;
    auVar84._12_4_ = auVar85._12_4_;
    auVar84._10_2_ = auVar56._4_2_;
    auVar84._0_10_ = auVar33._0_10_;
    auVar83._10_6_ = auVar84._10_6_;
    auVar83._8_2_ = sVar38;
    auVar83._0_8_ = uVar31;
    auVar82._8_8_ = auVar83._8_8_;
    auVar82._6_2_ = auVar56._2_2_;
    auVar82._0_6_ = uVar30;
    auVar81._6_10_ = auVar82._6_10_;
    auVar81._4_2_ = sVar36;
    auVar81._0_4_ = CONCAT22(sVar36,sVar28);
    auVar80._4_12_ = auVar81._4_12_;
    auVar80._2_2_ = auVar56._0_2_;
    auVar80._0_2_ = sVar28;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar80;
    *(short *)(dqcoeff_ptr + 0xc) = sVar42;
    *(short *)((long)dqcoeff_ptr + 0x32) = auVar56._8_2_;
    *(short *)(dqcoeff_ptr + 0xd) = auVar33._10_2_;
    *(short *)((long)dqcoeff_ptr + 0x36) = auVar56._10_2_;
    *(short *)(dqcoeff_ptr + 0xe) = auVar131._12_2_;
    *(short *)((long)dqcoeff_ptr + 0x3a) = auVar56._12_2_;
    *(short *)(dqcoeff_ptr + 0xf) = auVar131._14_2_;
    *(short *)((long)dqcoeff_ptr + 0x3e) = auVar56._14_2_;
    uVar37 = ~-(ushort)(sVar17 == 0) & *iscan_ptr + -(ushort)(sVar17 == 0) + 1;
    uVar46 = ~-(ushort)(sVar24 == 0) & iscan_ptr[1] + -(ushort)(sVar24 == 0) + 1;
    uVar45 = ~-(ushort)(sVar25 == 0) & iscan_ptr[2] + -(ushort)(sVar25 == 0) + 1;
    uVar44 = ~-(ushort)(sVar26 == 0) & iscan_ptr[3] + -(ushort)(sVar26 == 0) + 1;
    uVar43 = ~-(ushort)(sVar27 == 0) & iscan_ptr[4] + -(ushort)(sVar27 == 0) + 1;
    uVar53 = ~-(ushort)(auVar21._10_2_ == 0) & iscan_ptr[5] + -(ushort)(auVar21._10_2_ == 0) + 1;
    uVar61 = ~-(ushort)(auVar23._12_2_ == 0) & iscan_ptr[6] + -(ushort)(auVar23._12_2_ == 0) + 1;
    uVar63 = ~-(ushort)(auVar23._14_2_ == 0) & iscan_ptr[7] + -(ushort)(auVar23._14_2_ == 0) + 1;
    uVar29 = ~-(ushort)(sVar28 == 0) & iscan_ptr[8] + -(ushort)(sVar28 == 0) + 1;
    uVar41 = ~-(ushort)(sVar36 == 0) & iscan_ptr[9] + -(ushort)(sVar36 == 0) + 1;
    uVar39 = ~-(ushort)(sVar38 == 0) & iscan_ptr[10] + -(ushort)(sVar38 == 0) + 1;
    uVar65 = ~-(ushort)(sVar40 == 0) & iscan_ptr[0xb] + -(ushort)(sVar40 == 0) + 1;
    uVar67 = ~-(ushort)(sVar42 == 0) & iscan_ptr[0xc] + -(ushort)(sVar42 == 0) + 1;
    uVar69 = ~-(ushort)(auVar33._10_2_ == 0) & iscan_ptr[0xd] + -(ushort)(auVar33._10_2_ == 0) + 1;
    uVar71 = ~-(ushort)(auVar131._12_2_ == 0) & iscan_ptr[0xe] + -(ushort)(auVar131._12_2_ == 0) + 1
    ;
    uVar73 = ~-(ushort)(auVar131._14_2_ == 0) & iscan_ptr[0xf] + -(ushort)(auVar131._14_2_ == 0) + 1
    ;
    uVar29 = ((short)uVar29 < (short)uVar37) * uVar37 | ((short)uVar29 >= (short)uVar37) * uVar29;
    uVar37 = ((short)uVar41 < (short)uVar46) * uVar46 | ((short)uVar41 >= (short)uVar46) * uVar41;
    uVar39 = ((short)uVar39 < (short)uVar45) * uVar45 | ((short)uVar39 >= (short)uVar45) * uVar39;
    uVar41 = ((short)uVar65 < (short)uVar44) * uVar44 | ((short)uVar65 >= (short)uVar44) * uVar65;
    uVar43 = ((short)uVar67 < (short)uVar43) * uVar43 | ((short)uVar67 >= (short)uVar43) * uVar67;
    uVar44 = ((short)uVar69 < (short)uVar53) * uVar53 | ((short)uVar69 >= (short)uVar53) * uVar69;
    uVar45 = ((short)uVar71 < (short)uVar61) * uVar61 | ((short)uVar71 >= (short)uVar61) * uVar71;
    uVar46 = ((short)uVar73 < (short)uVar63) * uVar63 | ((short)uVar73 >= (short)uVar63) * uVar73;
    uVar29 = (0 < (short)uVar29) * uVar29;
    uVar37 = (0 < (short)uVar37) * uVar37;
    uVar39 = (0 < (short)uVar39) * uVar39;
    uVar41 = (0 < (short)uVar41) * uVar41;
    uVar43 = (0 < (short)uVar43) * uVar43;
    uVar44 = (0 < (short)uVar44) * uVar44;
    uVar45 = (0 < (short)uVar45) * uVar45;
    uVar46 = (0 < (short)uVar46) * uVar46;
  }
  if (0x10 - n_coeffs < 0) {
    lVar5 = 0;
    auVar35._8_4_ = 0xffffffff;
    auVar35._0_8_ = 0xffffffffffffffff;
    auVar35._12_4_ = 0xffffffff;
    do {
      auVar56 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar5 + 0x10),
                         *(undefined1 (*) [16])(coeff_ptr + lVar5 + 0x14));
      auVar23 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar5 + 0x18),
                         *(undefined1 (*) [16])(coeff_ptr + lVar5 + 0x1c));
      sVar40 = auVar56._0_2_;
      sVar17 = -sVar40;
      sVar42 = auVar56._2_2_;
      sVar24 = -sVar42;
      sVar86 = auVar56._4_2_;
      sVar25 = -sVar86;
      sVar87 = auVar56._6_2_;
      sVar26 = -sVar87;
      sVar88 = auVar56._8_2_;
      sVar27 = -sVar88;
      sVar89 = auVar56._10_2_;
      sVar28 = -sVar89;
      sVar90 = auVar56._12_2_;
      sVar36 = -sVar90;
      sVar91 = auVar56._14_2_;
      sVar38 = -sVar91;
      auVar49._0_2_ = (ushort)(sVar17 < sVar40) * sVar40 | (ushort)(sVar17 >= sVar40) * sVar17;
      auVar49._2_2_ = (ushort)(sVar24 < sVar42) * sVar42 | (ushort)(sVar24 >= sVar42) * sVar24;
      auVar49._4_2_ = (ushort)(sVar25 < sVar86) * sVar86 | (ushort)(sVar25 >= sVar86) * sVar25;
      auVar49._6_2_ = (ushort)(sVar26 < sVar87) * sVar87 | (ushort)(sVar26 >= sVar87) * sVar26;
      auVar49._8_2_ = (ushort)(sVar27 < sVar88) * sVar88 | (ushort)(sVar27 >= sVar88) * sVar27;
      auVar49._10_2_ = (ushort)(sVar28 < sVar89) * sVar89 | (ushort)(sVar28 >= sVar89) * sVar28;
      auVar49._12_2_ = (ushort)(sVar36 < sVar90) * sVar90 | (ushort)(sVar36 >= sVar90) * sVar36;
      auVar49._14_2_ = (ushort)(sVar38 < sVar91) * sVar91 | (ushort)(sVar38 >= sVar91) * sVar38;
      sVar40 = auVar23._0_2_;
      sVar17 = -sVar40;
      sVar42 = auVar23._2_2_;
      sVar24 = -sVar42;
      sVar86 = auVar23._4_2_;
      sVar25 = -sVar86;
      sVar87 = auVar23._6_2_;
      sVar26 = -sVar87;
      sVar88 = auVar23._8_2_;
      sVar27 = -sVar88;
      sVar89 = auVar23._10_2_;
      sVar28 = -sVar89;
      sVar90 = auVar23._12_2_;
      sVar36 = -sVar90;
      sVar91 = auVar23._14_2_;
      sVar38 = -sVar91;
      auVar57._0_2_ = (ushort)(sVar17 < sVar40) * sVar40 | (ushort)(sVar17 >= sVar40) * sVar17;
      auVar57._2_2_ = (ushort)(sVar24 < sVar42) * sVar42 | (ushort)(sVar24 >= sVar42) * sVar24;
      auVar57._4_2_ = (ushort)(sVar25 < sVar86) * sVar86 | (ushort)(sVar25 >= sVar86) * sVar25;
      auVar57._6_2_ = (ushort)(sVar26 < sVar87) * sVar87 | (ushort)(sVar26 >= sVar87) * sVar26;
      auVar57._8_2_ = (ushort)(sVar27 < sVar88) * sVar88 | (ushort)(sVar27 >= sVar88) * sVar27;
      auVar57._10_2_ = (ushort)(sVar28 < sVar89) * sVar89 | (ushort)(sVar28 >= sVar89) * sVar28;
      auVar57._12_2_ = (ushort)(sVar36 < sVar90) * sVar90 | (ushort)(sVar36 >= sVar90) * sVar36;
      auVar57._14_2_ = (ushort)(sVar38 < sVar91) * sVar91 | (ushort)(sVar38 >= sVar91) * sVar38;
      auVar129._0_2_ = -(ushort)((short)auVar49._0_2_ < sVar8);
      auVar129._2_2_ = -(ushort)((short)auVar49._2_2_ < sVar11);
      auVar129._4_2_ = -(ushort)((short)auVar49._4_2_ < sVar135);
      auVar129._6_2_ = -(ushort)((short)auVar49._6_2_ < sVar136);
      auVar129._8_2_ = -(ushort)((short)auVar49._8_2_ < sVar137);
      auVar129._10_2_ = -(ushort)((short)auVar49._10_2_ < sVar138);
      auVar129._12_2_ = -(ushort)((short)auVar49._12_2_ < sVar139);
      auVar129._14_2_ = -(ushort)((short)auVar49._14_2_ < sVar140);
      auVar130._0_2_ = -(ushort)((short)auVar57._0_2_ < sVar8);
      auVar130._2_2_ = -(ushort)((short)auVar57._2_2_ < sVar11);
      auVar130._4_2_ = -(ushort)((short)auVar57._4_2_ < sVar135);
      auVar130._6_2_ = -(ushort)((short)auVar57._6_2_ < sVar136);
      auVar130._8_2_ = -(ushort)((short)auVar57._8_2_ < sVar137);
      auVar130._10_2_ = -(ushort)((short)auVar57._10_2_ < sVar138);
      auVar130._12_2_ = -(ushort)((short)auVar57._12_2_ < sVar139);
      auVar130._14_2_ = -(ushort)((short)auVar57._14_2_ < sVar140);
      auVar131 = auVar130 ^ auVar35 | auVar129 ^ auVar35;
      if ((((((((((((((((auVar131 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar131 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar131 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar131 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar131 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar131 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar131 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar131 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar131 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar131 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar131 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar131 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar131 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar131 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar131 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar131[0xf]
         ) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x1c) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x14) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x10) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x1c) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x14) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x10) = (undefined1  [16])0x0;
      }
      else {
        auVar16 = psraw(auVar56,0xf);
        auVar131 = psraw(auVar23,0xf);
        auVar23 = paddsw(auVar49,auVar6);
        auVar56 = paddsw(auVar57,auVar6);
        auVar23 = pmulhw(auVar23,auVar9);
        auVar56 = pmulhw(auVar56,auVar9);
        auVar23 = auVar23 ^ auVar16;
        auVar56 = auVar56 ^ auVar131;
        sVar17 = auVar23._0_2_ - auVar16._0_2_;
        sVar24 = auVar23._2_2_ - auVar16._2_2_;
        sVar25 = auVar23._4_2_ - auVar16._4_2_;
        uVar18 = CONCAT24(sVar25,CONCAT22(sVar24,sVar17));
        sVar26 = auVar23._6_2_ - auVar16._6_2_;
        uVar19 = CONCAT26(sVar26,uVar18);
        sVar27 = auVar23._8_2_ - auVar16._8_2_;
        auVar47._0_10_ = CONCAT28(sVar27,uVar19);
        auVar47._10_2_ = auVar23._10_2_ - auVar16._10_2_;
        auVar50._12_2_ = auVar23._12_2_ - auVar16._12_2_;
        auVar50._0_12_ = auVar47;
        auVar50._14_2_ = auVar23._14_2_ - auVar16._14_2_;
        sVar28 = auVar56._0_2_ - auVar131._0_2_;
        sVar36 = auVar56._2_2_ - auVar131._2_2_;
        sVar38 = auVar56._4_2_ - auVar131._4_2_;
        uVar30 = CONCAT24(sVar38,CONCAT22(sVar36,sVar28));
        sVar40 = auVar56._6_2_ - auVar131._6_2_;
        uVar31 = CONCAT26(sVar40,uVar30);
        sVar42 = auVar56._8_2_ - auVar131._8_2_;
        auVar54._0_10_ = CONCAT28(sVar42,uVar31);
        auVar54._10_2_ = auVar56._10_2_ - auVar131._10_2_;
        auVar58._12_2_ = auVar56._12_2_ - auVar131._12_2_;
        auVar58._0_12_ = auVar54;
        auVar58._14_2_ = auVar56._14_2_ - auVar131._14_2_;
        auVar23 = psraw(auVar50,0xf);
        auVar109._12_2_ = sVar26;
        auVar109._0_12_ = auVar47;
        auVar109._14_2_ = auVar23._6_2_;
        auVar108._12_4_ = auVar109._12_4_;
        auVar108._10_2_ = auVar23._4_2_;
        auVar108._0_10_ = auVar47._0_10_;
        auVar107._10_6_ = auVar108._10_6_;
        auVar107._8_2_ = sVar25;
        auVar107._0_8_ = uVar19;
        auVar106._8_8_ = auVar107._8_8_;
        auVar106._6_2_ = auVar23._2_2_;
        auVar106._0_6_ = uVar18;
        auVar105._6_10_ = auVar106._6_10_;
        auVar105._4_2_ = sVar24;
        auVar105._0_4_ = CONCAT22(sVar24,sVar17);
        auVar104._4_12_ = auVar105._4_12_;
        auVar104._2_2_ = auVar23._0_2_;
        auVar104._0_2_ = sVar17;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x10) = auVar104;
        ptVar2 = qcoeff_ptr + lVar5 + 0x14;
        *(short *)ptVar2 = sVar27;
        *(short *)((long)ptVar2 + 2) = auVar23._8_2_;
        *(short *)(ptVar2 + 1) = auVar47._10_2_;
        *(short *)((long)ptVar2 + 6) = auVar23._10_2_;
        *(short *)(ptVar2 + 2) = auVar50._12_2_;
        *(short *)((long)ptVar2 + 10) = auVar23._12_2_;
        *(short *)(ptVar2 + 3) = auVar50._14_2_;
        *(short *)((long)ptVar2 + 0xe) = auVar23._14_2_;
        auVar23 = psraw(auVar58,0xf);
        auVar115._12_2_ = sVar40;
        auVar115._0_12_ = auVar54;
        auVar115._14_2_ = auVar23._6_2_;
        auVar114._12_4_ = auVar115._12_4_;
        auVar114._10_2_ = auVar23._4_2_;
        auVar114._0_10_ = auVar54._0_10_;
        auVar113._10_6_ = auVar114._10_6_;
        auVar113._8_2_ = sVar38;
        auVar113._0_8_ = uVar31;
        auVar112._8_8_ = auVar113._8_8_;
        auVar112._6_2_ = auVar23._2_2_;
        auVar112._0_6_ = uVar30;
        auVar111._6_10_ = auVar112._6_10_;
        auVar111._4_2_ = sVar36;
        auVar111._0_4_ = CONCAT22(sVar36,sVar28);
        auVar110._4_12_ = auVar111._4_12_;
        auVar110._2_2_ = auVar23._0_2_;
        auVar110._0_2_ = sVar28;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar5 + 0x18) = auVar110;
        ptVar2 = qcoeff_ptr + lVar5 + 0x1c;
        *(short *)ptVar2 = sVar42;
        *(short *)((long)ptVar2 + 2) = auVar23._8_2_;
        *(short *)(ptVar2 + 1) = auVar54._10_2_;
        *(short *)((long)ptVar2 + 6) = auVar23._10_2_;
        *(short *)(ptVar2 + 2) = auVar58._12_2_;
        *(short *)((long)ptVar2 + 10) = auVar23._12_2_;
        *(short *)(ptVar2 + 3) = auVar58._14_2_;
        *(short *)((long)ptVar2 + 0xe) = auVar23._14_2_;
        sVar17 = sVar17 * sVar12;
        sVar24 = sVar24 * sVar13;
        sVar25 = sVar25 * sVar14;
        uVar18 = CONCAT24(sVar25,CONCAT22(sVar24,sVar17));
        sVar26 = sVar26 * sVar15;
        uVar19 = CONCAT26(sVar26,uVar18);
        sVar27 = sVar27 * sVar12;
        auVar48._0_10_ = CONCAT28(sVar27,uVar19);
        auVar48._10_2_ = auVar47._10_2_ * sVar13;
        auVar51._12_2_ = auVar50._12_2_ * sVar14;
        auVar51._0_12_ = auVar48;
        auVar51._14_2_ = auVar50._14_2_ * sVar15;
        sVar28 = sVar28 * sVar12;
        sVar36 = sVar36 * sVar13;
        sVar38 = sVar38 * sVar14;
        uVar30 = CONCAT24(sVar38,CONCAT22(sVar36,sVar28));
        sVar40 = sVar40 * sVar15;
        uVar31 = CONCAT26(sVar40,uVar30);
        sVar42 = sVar42 * sVar12;
        auVar55._0_10_ = CONCAT28(sVar42,uVar31);
        auVar55._10_2_ = auVar54._10_2_ * sVar13;
        auVar59._12_2_ = auVar58._12_2_ * sVar14;
        auVar59._0_12_ = auVar55;
        auVar59._14_2_ = auVar58._14_2_ * sVar15;
        auVar23 = psraw(auVar51,0xf);
        auVar121._12_2_ = sVar26;
        auVar121._0_12_ = auVar48;
        auVar121._14_2_ = auVar23._6_2_;
        auVar120._12_4_ = auVar121._12_4_;
        auVar120._10_2_ = auVar23._4_2_;
        auVar120._0_10_ = auVar48._0_10_;
        auVar119._10_6_ = auVar120._10_6_;
        auVar119._8_2_ = sVar25;
        auVar119._0_8_ = uVar19;
        auVar118._8_8_ = auVar119._8_8_;
        auVar118._6_2_ = auVar23._2_2_;
        auVar118._0_6_ = uVar18;
        auVar117._6_10_ = auVar118._6_10_;
        auVar117._4_2_ = sVar24;
        auVar117._0_4_ = CONCAT22(sVar24,sVar17);
        auVar116._4_12_ = auVar117._4_12_;
        auVar116._2_2_ = auVar23._0_2_;
        auVar116._0_2_ = sVar17;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x10) = auVar116;
        ptVar2 = dqcoeff_ptr + lVar5 + 0x14;
        *(short *)ptVar2 = sVar27;
        *(short *)((long)ptVar2 + 2) = auVar23._8_2_;
        *(short *)(ptVar2 + 1) = auVar48._10_2_;
        *(short *)((long)ptVar2 + 6) = auVar23._10_2_;
        *(short *)(ptVar2 + 2) = auVar51._12_2_;
        *(short *)((long)ptVar2 + 10) = auVar23._12_2_;
        *(short *)(ptVar2 + 3) = auVar51._14_2_;
        *(short *)((long)ptVar2 + 0xe) = auVar23._14_2_;
        auVar23 = psraw(auVar59,0xf);
        auVar127._12_2_ = sVar40;
        auVar127._0_12_ = auVar55;
        auVar127._14_2_ = auVar23._6_2_;
        auVar126._12_4_ = auVar127._12_4_;
        auVar126._10_2_ = auVar23._4_2_;
        auVar126._0_10_ = auVar55._0_10_;
        auVar125._10_6_ = auVar126._10_6_;
        auVar125._8_2_ = sVar38;
        auVar125._0_8_ = uVar31;
        auVar124._8_8_ = auVar125._8_8_;
        auVar124._6_2_ = auVar23._2_2_;
        auVar124._0_6_ = uVar30;
        auVar123._6_10_ = auVar124._6_10_;
        auVar123._4_2_ = sVar36;
        auVar123._0_4_ = CONCAT22(sVar36,sVar28);
        auVar122._4_12_ = auVar123._4_12_;
        auVar122._2_2_ = auVar23._0_2_;
        auVar122._0_2_ = sVar28;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar5 + 0x18) = auVar122;
        ptVar2 = dqcoeff_ptr + lVar5 + 0x1c;
        *(short *)ptVar2 = sVar42;
        *(short *)((long)ptVar2 + 2) = auVar23._8_2_;
        *(short *)(ptVar2 + 1) = auVar55._10_2_;
        *(short *)((long)ptVar2 + 6) = auVar23._10_2_;
        *(short *)(ptVar2 + 2) = auVar59._12_2_;
        *(short *)((long)ptVar2 + 10) = auVar23._12_2_;
        *(short *)(ptVar2 + 3) = auVar59._14_2_;
        *(short *)((long)ptVar2 + 0xe) = auVar23._14_2_;
        psVar3 = iscan_ptr + lVar5 + 0x10;
        psVar4 = iscan_ptr + lVar5 + 0x18;
        uVar53 = ~-(ushort)(sVar17 == 0) & *psVar3 + -(ushort)(sVar17 == 0) + 1;
        uVar61 = ~-(ushort)(sVar24 == 0) & psVar3[1] + -(ushort)(sVar24 == 0) + 1;
        uVar63 = ~-(ushort)(sVar25 == 0) & psVar3[2] + -(ushort)(sVar25 == 0) + 1;
        uVar65 = ~-(ushort)(sVar26 == 0) & psVar3[3] + -(ushort)(sVar26 == 0) + 1;
        uVar67 = ~-(ushort)(sVar27 == 0) & psVar3[4] + -(ushort)(sVar27 == 0) + 1;
        uVar69 = ~-(ushort)(auVar48._10_2_ == 0) & psVar3[5] + -(ushort)(auVar48._10_2_ == 0) + 1;
        uVar71 = ~-(ushort)(auVar51._12_2_ == 0) & psVar3[6] + -(ushort)(auVar51._12_2_ == 0) + 1;
        uVar73 = ~-(ushort)(auVar51._14_2_ == 0) & psVar3[7] + -(ushort)(auVar51._14_2_ == 0) + 1;
        uVar52 = ~-(ushort)(sVar28 == 0) & *psVar4 + -(ushort)(sVar28 == 0) + 1;
        uVar60 = ~-(ushort)(sVar36 == 0) & psVar4[1] + -(ushort)(sVar36 == 0) + 1;
        uVar62 = ~-(ushort)(sVar38 == 0) & psVar4[2] + -(ushort)(sVar38 == 0) + 1;
        uVar64 = ~-(ushort)(sVar40 == 0) & psVar4[3] + -(ushort)(sVar40 == 0) + 1;
        uVar66 = ~-(ushort)(sVar42 == 0) & psVar4[4] + -(ushort)(sVar42 == 0) + 1;
        uVar68 = ~-(ushort)(auVar55._10_2_ == 0) & psVar4[5] + -(ushort)(auVar55._10_2_ == 0) + 1;
        uVar70 = ~-(ushort)(auVar59._12_2_ == 0) & psVar4[6] + -(ushort)(auVar59._12_2_ == 0) + 1;
        uVar72 = ~-(ushort)(auVar59._14_2_ == 0) & psVar4[7] + -(ushort)(auVar59._14_2_ == 0) + 1;
        uVar53 = ((short)uVar52 < (short)uVar53) * uVar53 |
                 ((short)uVar52 >= (short)uVar53) * uVar52;
        uVar61 = ((short)uVar60 < (short)uVar61) * uVar61 |
                 ((short)uVar60 >= (short)uVar61) * uVar60;
        uVar63 = ((short)uVar62 < (short)uVar63) * uVar63 |
                 ((short)uVar62 >= (short)uVar63) * uVar62;
        uVar65 = ((short)uVar64 < (short)uVar65) * uVar65 |
                 ((short)uVar64 >= (short)uVar65) * uVar64;
        uVar67 = ((short)uVar66 < (short)uVar67) * uVar67 |
                 ((short)uVar66 >= (short)uVar67) * uVar66;
        uVar69 = ((short)uVar68 < (short)uVar69) * uVar69 |
                 ((short)uVar68 >= (short)uVar69) * uVar68;
        uVar71 = ((short)uVar70 < (short)uVar71) * uVar71 |
                 ((short)uVar70 >= (short)uVar71) * uVar70;
        uVar73 = ((short)uVar72 < (short)uVar73) * uVar73 |
                 ((short)uVar72 >= (short)uVar73) * uVar72;
        uVar29 = ((short)uVar29 < (short)uVar53) * uVar53 |
                 ((short)uVar29 >= (short)uVar53) * uVar29;
        uVar37 = ((short)uVar37 < (short)uVar61) * uVar61 |
                 ((short)uVar37 >= (short)uVar61) * uVar37;
        uVar39 = ((short)uVar39 < (short)uVar63) * uVar63 |
                 ((short)uVar39 >= (short)uVar63) * uVar39;
        uVar41 = ((short)uVar41 < (short)uVar65) * uVar65 |
                 ((short)uVar41 >= (short)uVar65) * uVar41;
        uVar43 = ((short)uVar43 < (short)uVar67) * uVar67 |
                 ((short)uVar43 >= (short)uVar67) * uVar43;
        uVar44 = ((short)uVar44 < (short)uVar69) * uVar69 |
                 ((short)uVar44 >= (short)uVar69) * uVar44;
        uVar45 = ((short)uVar45 < (short)uVar71) * uVar71 |
                 ((short)uVar45 >= (short)uVar71) * uVar45;
        uVar46 = ((short)uVar46 < (short)uVar73) * uVar73 |
                 ((short)uVar46 >= (short)uVar73) * uVar46;
      }
      lVar1 = lVar5 - n_coeffs;
      lVar5 = lVar5 + 0x10;
    } while (lVar1 + 0x10 < -0x10);
  }
  auVar7._0_2_ = ((short)uVar43 < (short)uVar29) * uVar29 |
                 ((short)uVar43 >= (short)uVar29) * uVar43;
  auVar7._2_2_ = ((short)uVar44 < (short)uVar37) * uVar37 |
                 ((short)uVar44 >= (short)uVar37) * uVar44;
  auVar7._4_2_ = ((short)uVar45 < (short)uVar39) * uVar39 |
                 ((short)uVar45 >= (short)uVar39) * uVar45;
  auVar7._6_2_ = ((short)uVar46 < (short)uVar41) * uVar41 |
                 ((short)uVar46 >= (short)uVar41) * uVar46;
  auVar7._8_2_ = ((short)uVar29 < (short)uVar43) * uVar43 |
                 ((short)uVar29 >= (short)uVar43) * uVar29;
  auVar7._10_2_ =
       ((short)uVar37 < (short)uVar44) * uVar44 | ((short)uVar37 >= (short)uVar44) * uVar37;
  auVar7._12_2_ =
       ((short)uVar29 < (short)uVar45) * uVar45 | ((short)uVar29 >= (short)uVar45) * uVar29;
  auVar7._14_2_ =
       ((short)uVar37 < (short)uVar46) * uVar46 | ((short)uVar37 >= (short)uVar46) * uVar37;
  auVar23 = pshuflw(auVar9,auVar7,0xe);
  sVar8 = auVar23._0_2_;
  auVar10._0_2_ =
       (sVar8 < (short)auVar7._0_2_) * auVar7._0_2_ | (ushort)(sVar8 >= (short)auVar7._0_2_) * sVar8
  ;
  sVar8 = auVar23._2_2_;
  auVar10._2_2_ =
       (sVar8 < (short)auVar7._2_2_) * auVar7._2_2_ | (ushort)(sVar8 >= (short)auVar7._2_2_) * sVar8
  ;
  sVar8 = auVar23._4_2_;
  auVar10._4_2_ =
       (sVar8 < (short)auVar7._4_2_) * auVar7._4_2_ | (ushort)(sVar8 >= (short)auVar7._4_2_) * sVar8
  ;
  sVar8 = auVar23._6_2_;
  auVar10._6_2_ =
       (sVar8 < (short)auVar7._6_2_) * auVar7._6_2_ | (ushort)(sVar8 >= (short)auVar7._6_2_) * sVar8
  ;
  sVar8 = auVar23._8_2_;
  auVar10._8_2_ =
       (sVar8 < (short)auVar7._8_2_) * auVar7._8_2_ | (ushort)(sVar8 >= (short)auVar7._8_2_) * sVar8
  ;
  sVar8 = auVar23._10_2_;
  auVar10._10_2_ =
       (sVar8 < (short)auVar7._10_2_) * auVar7._10_2_ |
       (ushort)(sVar8 >= (short)auVar7._10_2_) * sVar8;
  sVar8 = auVar23._12_2_;
  sVar11 = auVar23._14_2_;
  auVar10._12_2_ =
       (sVar8 < (short)auVar7._12_2_) * auVar7._12_2_ |
       (ushort)(sVar8 >= (short)auVar7._12_2_) * sVar8;
  auVar10._14_2_ =
       (sVar11 < (short)auVar7._14_2_) * auVar7._14_2_ |
       (ushort)(sVar11 >= (short)auVar7._14_2_) * sVar11;
  auVar23 = pshuflw(auVar7,auVar10,1);
  sVar8 = auVar23._2_2_;
  *eob_ptr = (sVar8 < (short)auVar10._2_2_) * auVar10._2_2_ |
             (ushort)(sVar8 >= (short)auVar10._2_2_) * sVar8;
  return;
}

Assistant:

void av1_quantize_fp_sse2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *zbin_ptr, const int16_t *round_ptr,
                          const int16_t *quant_ptr,
                          const int16_t *quant_shift_ptr,
                          tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  coeff_ptr += n_coeffs;
  iscan_ptr += n_coeffs;
  qcoeff_ptr += n_coeffs;
  dqcoeff_ptr += n_coeffs;
  n_coeffs = -n_coeffs;

  const __m128i round0 = _mm_load_si128((const __m128i *)round_ptr);
  const __m128i round1 = _mm_unpackhi_epi64(round0, round0);
  const __m128i quant0 = _mm_load_si128((const __m128i *)quant_ptr);
  const __m128i quant1 = _mm_unpackhi_epi64(quant0, quant0);
  const __m128i dequant0 = _mm_load_si128((const __m128i *)dequant_ptr);
  const __m128i dequant1 = _mm_unpackhi_epi64(dequant0, dequant0);
  const __m128i thr0 = _mm_srai_epi16(dequant0, 1);
  const __m128i thr1 = _mm_srai_epi16(dequant1, 1);
  __m128i eob = _mm_setzero_si128();

  quantize(iscan_ptr, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round0,
           &round1, &quant0, &quant1, &dequant0, &dequant1, &thr0, &thr1, &eob);

  n_coeffs += 8 * 2;

  // AC only loop
  while (n_coeffs < 0) {
    quantize(iscan_ptr, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round1,
             &round1, &quant1, &quant1, &dequant1, &dequant1, &thr1, &thr1,
             &eob);
    n_coeffs += 8 * 2;
  }

  // Accumulate EOB
  {
    __m128i eob_shuffled;
    eob_shuffled = _mm_shuffle_epi32(eob, 0xe);
    eob = _mm_max_epi16(eob, eob_shuffled);
    eob_shuffled = _mm_shufflelo_epi16(eob, 0xe);
    eob = _mm_max_epi16(eob, eob_shuffled);
    eob_shuffled = _mm_shufflelo_epi16(eob, 0x1);
    eob = _mm_max_epi16(eob, eob_shuffled);
    *eob_ptr = _mm_extract_epi16(eob, 1);
  }
}